

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table.cc
# Opt level: O3

Iterator * leveldb::Table::BlockReader(void *arg,ReadOptions *options,Slice *index_value)

{
  Block *pBVar1;
  undefined8 uVar2;
  Iterator *this;
  void *arg2;
  Block *this_00;
  code *func;
  Status s;
  BlockHandle handle;
  BlockContents contents;
  char cache_key_buffer [16];
  Slice key;
  Slice input;
  undefined1 local_a0 [12];
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  BlockContents local_80;
  char *local_68;
  undefined8 local_60;
  char *local_50;
  char **local_48;
  undefined8 local_40;
  char *local_38;
  size_t sStack_30;
  
  pBVar1 = *(Block **)(*arg + 0x30);
  local_a0._8_4_ = 0xffffffff;
  uStack_94 = 0xffffffff;
  uStack_90 = 0xffffffff;
  uStack_8c = 0xffffffff;
  local_38 = index_value->data_;
  sStack_30 = index_value->size_;
  BlockHandle::DecodeFrom((BlockHandle *)local_a0,(Slice *)(local_a0 + 8));
  if ((char *)local_a0._0_8_ == (char *)0x0) {
    local_80.data.data_ = "";
    local_80.data.size_ = 0;
    if (pBVar1 == (Block *)0x0) {
      ReadBlock((leveldb *)&local_68,*(RandomAccessFile **)(*arg + 0x68),options,
                (BlockHandle *)(local_a0 + 8),&local_80);
      uVar2 = local_a0._0_8_;
      local_a0._0_8_ = local_68;
      local_68 = (char *)uVar2;
      if ((char *)uVar2 != (char *)0x0) {
        operator_delete__((void *)uVar2);
      }
      if ((char *)local_a0._0_8_ == (char *)0x0) {
        this_00 = (Block *)operator_new(0x18);
        Block::Block(this_00,&local_80);
LAB_0011b6bb:
        arg2 = (void *)0x0;
        goto LAB_0011b6be;
      }
    }
    else {
      local_68 = *(char **)(*arg + 0x70);
      local_48 = &local_68;
      local_60 = CONCAT44(uStack_94,local_a0._8_4_);
      local_40 = 0x10;
      arg2 = (void *)(**(code **)(pBVar1->data_ + 0x18))(pBVar1);
      if (arg2 == (void *)0x0) {
        ReadBlock((leveldb *)&local_50,*(RandomAccessFile **)(*arg + 0x68),options,
                  (BlockHandle *)(local_a0 + 8),&local_80);
        uVar2 = local_a0._0_8_;
        local_a0._0_8_ = local_50;
        local_50 = (char *)uVar2;
        if ((char *)uVar2 != (char *)0x0) {
          operator_delete__((void *)uVar2);
        }
        if ((char *)local_a0._0_8_ == (char *)0x0) {
          this_00 = (Block *)operator_new(0x18);
          Block::Block(this_00,&local_80);
          if ((local_80.cachable != true) || (options->fill_cache != true)) goto LAB_0011b6bb;
          arg2 = (void *)(**(code **)(pBVar1->data_ + 0x10))
                                   (pBVar1,&local_48,this_00,this_00->size_,DeleteCachedBlock);
          goto LAB_0011b6be;
        }
      }
      else {
        this_00 = (Block *)(**(code **)(pBVar1->data_ + 0x28))(pBVar1,arg2);
        if (this_00 != (Block *)0x0) {
LAB_0011b6be:
          this = Block::NewIterator(this_00,(Comparator *)**arg);
          if (arg2 == (void *)0x0) {
            func = DeleteBlock;
            arg2 = (void *)0x0;
          }
          else {
            func = ReleaseBlock;
            this_00 = pBVar1;
          }
          Iterator::RegisterCleanup(this,func,this_00,arg2);
          goto LAB_0011b522;
        }
      }
    }
  }
  this = NewErrorIterator((Status *)local_a0);
LAB_0011b522:
  if ((char *)local_a0._0_8_ != (char *)0x0) {
    operator_delete__((void *)local_a0._0_8_);
  }
  return this;
}

Assistant:

Iterator* Table::BlockReader(void* arg, const ReadOptions& options,
                             const Slice& index_value) {
  Table* table = reinterpret_cast<Table*>(arg);
  Cache* block_cache = table->rep_->options.block_cache;
  Block* block = nullptr;
  Cache::Handle* cache_handle = nullptr;

  BlockHandle handle;
  Slice input = index_value;
  Status s = handle.DecodeFrom(&input);
  // We intentionally allow extra stuff in index_value so that we
  // can add more features in the future.

  if (s.ok()) {
    BlockContents contents;
    if (block_cache != nullptr) {
      char cache_key_buffer[16];
      EncodeFixed64(cache_key_buffer, table->rep_->cache_id);
      EncodeFixed64(cache_key_buffer + 8, handle.offset());
      Slice key(cache_key_buffer, sizeof(cache_key_buffer));
      cache_handle = block_cache->Lookup(key);
      if (cache_handle != nullptr) {
        block = reinterpret_cast<Block*>(block_cache->Value(cache_handle));
      } else {
        s = ReadBlock(table->rep_->file, options, handle, &contents);
        if (s.ok()) {
          block = new Block(contents);
          if (contents.cachable && options.fill_cache) {
            cache_handle = block_cache->Insert(key, block, block->size(),
                                               &DeleteCachedBlock);
          }
        }
      }
    } else {
      s = ReadBlock(table->rep_->file, options, handle, &contents);
      if (s.ok()) {
        block = new Block(contents);
      }
    }
  }

  Iterator* iter;
  if (block != nullptr) {
    iter = block->NewIterator(table->rep_->options.comparator);
    if (cache_handle == nullptr) {
      iter->RegisterCleanup(&DeleteBlock, block, nullptr);
    } else {
      iter->RegisterCleanup(&ReleaseBlock, block_cache, cache_handle);
    }
  } else {
    iter = NewErrorIterator(s);
  }
  return iter;
}